

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeMultipleTexturesCase::verifyResult
          (DecodeMultipleTexturesCase *this)

{
  TestLog *pTVar1;
  ulong uVar2;
  deUint32 dVar3;
  int i;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vec4 pixelExpected0;
  Vector<bool,_4> res;
  long *local_228;
  long local_220;
  long local_218 [3];
  float local_200;
  float local_1fc;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1f8;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8 [4];
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [264];
  Vec4 local_38;
  Vec4 local_28;
  
  pTVar1 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = 0.0;
  fStack_1d4 = 0.0;
  fStack_1d0 = 0.0;
  fStack_1cc = 0.0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels(&this->super_SRGBTestCase,&local_1f8);
  local_1b8 = (undefined1  [8])0x3e99999a3e4ccccd;
  pp_Stack_1b0 = (_func_int **)0x3f8000003ecccccd;
  tcu::linearToSRGB((tcu *)local_1c8,(Vec4 *)local_1b8);
  dVar3 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  if (dVar3 == 0x8fbd) {
    local_1c8[1] = 0.0;
    local_1c8[2] = 0.0;
  }
  local_1d8 = local_1c8[0];
  fStack_1d4 = (float)local_1c8._4_8_;
  fStack_1d0 = SUB84(local_1c8._4_8_,4);
  fStack_1cc = local_1c8[3];
  dVar3 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  local_1fc = 0.0;
  local_200 = 0.0;
  if (dVar3 != 0x8fbd) {
    local_200 = 0.3;
    local_1fc = 0.4;
  }
  local_1b8 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Expected color: ","");
  local_38.m_data[1] = fStack_1d4;
  local_38.m_data[0] = local_1d8;
  local_38.m_data[3] = fStack_1cc;
  local_38.m_data[2] = fStack_1d0;
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_1b8,0,&local_38);
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity + 1);
  }
  local_1b8 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Expected color: ","");
  local_28.m_data[0] = 0.2;
  local_28.m_data[1] = local_200;
  local_28.m_data[2] = local_1fc;
  local_28.m_data[3] = 1.0;
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_1b8,1,&local_28);
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity + 1);
  }
  local_1b8 = (undefined1  [8])0x0;
  lVar4 = 0;
  do {
    local_1b8[lVar4] =
         (local_1f8.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start)->m_data[lVar4] ==
         local_1f8.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (local_1b8[0] == (string)0x0) {
    bVar6 = false;
  }
  else {
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if (uVar5 == 3) break;
      uVar2 = uVar5 + 1;
    } while (local_1b8[uVar5 + 1] != '\0');
    bVar6 = 2 < uVar5;
  }
  local_1b8 = (undefined1  [8])pTVar1;
  if (bVar6 == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"texel values are different","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,(char *)local_228,local_220);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"texel values are equal","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,(char *)local_228,local_220);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  if (local_1f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool DecodeMultipleTexturesCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelExpected0;
	tcu::Vec4				pixelExpected1;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelExpected0 = this->formatReferenceColor(getColorReferenceSRGB());
	pixelExpected1 = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected0);
	this->logColor(std::string("Expected color: "), resultColorIdx +1, pixelExpected1);

	//	check if the two textures have different values i.e. uTexture0 = sRGB and uTexture1 = linear
	if ( !(tcu::boolAll(tcu::equal(pixelResultList[resultColorIdx], pixelResultList[resultColorIdx +1]))) )
	{
		log << tcu::TestLog::Message << std::string("texel values are different") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("texel values are equal") << tcu::TestLog::EndMessage;
		return false;
	}
}